

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagecontrol.cpp
# Opt level: O0

void __thiscall QtMWidgets::PageControl::mousePressEvent(PageControl *this,QMouseEvent *e)

{
  MouseButton MVar1;
  PageControlPrivate *pPVar2;
  QPoint __addr_len;
  sockaddr *__addr;
  int __fd;
  QMouseEvent *e_local;
  PageControl *this_local;
  
  __fd = (int)e;
  MVar1 = QSinglePointEvent::button((QSinglePointEvent *)e);
  if (MVar1 == LeftButton) {
    pPVar2 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
             ::operator->(&this->d);
    pPVar2->leftButtonPressed = true;
    __addr_len = QMouseEvent::pos(e);
    pPVar2 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
             ::operator->(&this->d);
    pPVar2->clickPos = __addr_len;
    QEvent::accept((QEvent *)e,__fd,__addr,(socklen_t *)__addr_len);
  }
  else {
    QEvent::ignore((QEvent *)e);
  }
  return;
}

Assistant:

void
PageControl::mousePressEvent( QMouseEvent * e )
{
	if( e->button() == Qt::LeftButton )
	{
		d->leftButtonPressed = true;

		d->clickPos = e->pos();

		e->accept();
	}
	else
		e->ignore();
}